

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::GetMemberTypeId
          (CopyPropagateArrays *this,uint32_t id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain)

{
  uint32_t index;
  bool bVar1;
  Op OVar2;
  reference puVar3;
  DefUseManager *this_00;
  Instruction *this_01;
  Instruction *type_inst;
  const_iterator cStack_38;
  uint32_t element_index;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *access_chain_local;
  uint32_t id_local;
  CopyPropagateArrays *this_local;
  
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(access_chain);
  cStack_38 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(access_chain);
  access_chain_local._4_4_ = id;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8);
    if (!bVar1) {
      return access_chain_local._4_4_;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    index = *puVar3;
    this_00 = Pass::get_def_use_mgr((Pass *)this);
    this_01 = analysis::DefUseManager::GetDef(this_00,access_chain_local._4_4_);
    OVar2 = Instruction::opcode(this_01);
    if ((OVar2 - OpTypeVector < 2) || (OVar2 - OpTypeArray < 2)) {
      access_chain_local._4_4_ = Instruction::GetSingleWordInOperand(this_01,0);
    }
    else if (OVar2 == OpTypeStruct) {
      access_chain_local._4_4_ = Instruction::GetSingleWordInOperand(this_01,index);
    }
    if (access_chain_local._4_4_ == 0) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("id != 0 && \"Tried to extract from an object where it cannot be done.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                ,0x31d,
                "uint32_t spvtools::opt::CopyPropagateArrays::GetMemberTypeId(uint32_t, const std::vector<uint32_t> &) const"
               );
}

Assistant:

uint32_t CopyPropagateArrays::GetMemberTypeId(
    uint32_t id, const std::vector<uint32_t>& access_chain) const {
  for (uint32_t element_index : access_chain) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeVector:
        id = type_inst->GetSingleWordInOperand(0);
        break;
      case spv::Op::OpTypeStruct:
        id = type_inst->GetSingleWordInOperand(element_index);
        break;
      default:
        break;
    }
    assert(id != 0 &&
           "Tried to extract from an object where it cannot be done.");
  }
  return id;
}